

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void __thiscall polyscope::Histogram::fillBuffers(Histogram *this)

{
  bool bVar1;
  element_type *peVar2;
  vec<2,_float,_(glm::qualifier)0> vVar3;
  vec<2,_float,_(glm::qualifier)0> vVar4;
  vec<2,_float,_(glm::qualifier)0> vVar5;
  vec<2,_float,_(glm::qualifier)0> vVar6;
  vec<2,_float,_(glm::qualifier)0> vVar7;
  ulong uVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  ulong uVar10;
  long lVar11;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  coords;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> histCurveX;
  vector<double,_std::allocator<double>_> histCurveY;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_110;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_10c;
  void *local_108;
  iterator iStack_100;
  vec<2,_float,_(glm::qualifier)0> *local_f8;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_e4;
  double local_e0;
  double local_d8;
  double local_d0;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = this->useSmoothed;
  if (bVar1 == true) {
    pvVar9 = &this->unweightedSmoothedHistCurveY;
    if (this->useWeighted != false) {
      pvVar9 = &this->weightedSmoothedHistCurveY;
    }
    lVar11 = 0x80;
    std::vector<double,_std::allocator<double>_>::operator=(&local_a8,pvVar9);
  }
  else {
    pvVar9 = &this->unweightedRawHistCurveY;
    if (this->useWeighted != false) {
      pvVar9 = &this->weightedRawHistCurveY;
    }
    lVar11 = 0x98;
    std::vector<double,_std::allocator<double>_>::operator=(&local_a8,pvVar9);
  }
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
            (&local_c8,
             (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
             ((long)&(this->colormapRange).first + lVar11));
  local_108 = (void *)0x0;
  iStack_100._M_current = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  local_f8 = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    peVar2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"a_coord","");
    (*peVar2->_vptr_ShaderProgram[0xf])(peVar2,local_50,&local_108,0,0,0xffffffff);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  else {
    if ((long)local_c8.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar8 = (long)local_c8.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar11 = 8;
      uVar10 = 0;
      do {
        local_d0 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
        local_e0 = local_d0;
        if (bVar1 != false) {
          if (uVar10 != 0) {
            local_e0 = (local_d0 +
                       local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10 - 1]) * 0.5;
          }
          if (uVar10 < uVar8 - 1) {
            local_d0 = (local_d0 +
                       local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10 + 1]) * 0.5;
          }
        }
        local_d8 = *(double *)
                    ((long)(local_c8.
                            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar11);
        local_110.x = (float)*(double *)
                              ((long)(local_c8.
                                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                              lVar11 + -8);
        aStack_10c.y = 0.0;
        local_e4.x = local_110.x;
        if (iStack_100._M_current == local_f8) {
          std::
          vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                    ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                      *)&local_108,iStack_100,(vec<2,_float,_(glm::qualifier)0> *)&local_110);
        }
        else {
          vVar3.field_1.y = 0.0;
          vVar3.field_0.x = local_110.x;
          *iStack_100._M_current = vVar3;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
        local_110.x = (float)local_d8;
        local_d8 = (double)CONCAT44(local_d8._4_4_,local_110);
        aStack_10c.y = 0.0;
        if (iStack_100._M_current == local_f8) {
          std::
          vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                    ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                      *)&local_108,iStack_100,(vec<2,_float,_(glm::qualifier)0> *)&local_110);
        }
        else {
          vVar4.field_1.y = 0.0;
          vVar4.field_0.x = local_110.x;
          *iStack_100._M_current = vVar4;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
        local_110.x = local_e4.x;
        aStack_10c.y = (float)local_e0;
        local_e0 = (double)CONCAT44(local_e0._4_4_,aStack_10c);
        if (iStack_100._M_current == local_f8) {
          std::
          vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                    ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                      *)&local_108,iStack_100,(vec<2,_float,_(glm::qualifier)0> *)&local_110);
        }
        else {
          vVar5.field_1.y = aStack_10c.y;
          vVar5.field_0.x = local_e4.x;
          *iStack_100._M_current = vVar5;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
        local_110 = local_d8._0_4_;
        aStack_10c.y = 0.0;
        if (iStack_100._M_current == local_f8) {
          std::
          vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                    ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                      *)&local_108,iStack_100,(vec<2,_float,_(glm::qualifier)0> *)&local_110);
        }
        else {
          *iStack_100._M_current = (vec<2,_float,_(glm::qualifier)0>)((ulong)local_d8 & 0xffffffff);
          iStack_100._M_current = iStack_100._M_current + 1;
        }
        local_110 = local_d8._0_4_;
        aStack_10c.y = (float)local_d0;
        if (iStack_100._M_current == local_f8) {
          std::
          vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                    ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                      *)&local_108,iStack_100,(vec<2,_float,_(glm::qualifier)0> *)&local_110);
        }
        else {
          vVar6.field_1.y = aStack_10c.y;
          vVar6.field_0 = local_d8._0_4_;
          *iStack_100._M_current = vVar6;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
        local_110 = local_e4;
        aStack_10c = local_e0._0_4_;
        if (iStack_100._M_current == local_f8) {
          std::
          vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                    ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                      *)&local_108,iStack_100,(vec<2,_float,_(glm::qualifier)0> *)&local_110);
        }
        else {
          vVar7.field_1 = local_e0._0_4_;
          vVar7.field_0 = local_e4;
          *iStack_100._M_current = vVar7;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
        uVar10 = uVar10 + 1;
        uVar8 = (long)local_c8.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
        lVar11 = lVar11 + 0x10;
      } while (uVar10 < uVar8);
    }
    peVar2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a_coord","");
    (*peVar2->_vptr_ShaderProgram[0xf])(peVar2,local_70,&local_108,0,0,0xffffffff);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    peVar2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"t_colormap","");
    (*peVar2->_vptr_ShaderProgram[0x19])(peVar2,local_90,&this->colormap,1);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    this->currBufferWeighted = this->useWeighted;
    this->currBufferSmoothed = this->useSmoothed;
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108);
  }
  if (local_c8.
      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Histogram::fillBuffers() {

  // Fill from proper curve depending on current settings
  // (does unecessary copy as written)
  std::vector<double> histCurveY;
  std::vector<std::array<double, 2>> histCurveX;
  bool smoothBins = false; // draw trapezoids rather than rectangles
  if (useSmoothed) {
    if (useWeighted) {
      histCurveY = weightedSmoothedHistCurveY;
    } else {
      histCurveY = unweightedSmoothedHistCurveY;
    }
    histCurveX = smoothedHistCurveX;
    smoothBins = true;
  } else {
    if (useWeighted) {
      histCurveY = weightedRawHistCurveY;
    } else {
      histCurveY = unweightedRawHistCurveY;
    }
    histCurveX = rawHistCurveX;
  }

  // Push to buffer
  std::vector<glm::vec2> coords;

  if (histCurveY.size() == 0) {
    program->setAttribute("a_coord", coords);
    return;
  }

  // Extra first triangle
  for (size_t i = 0; i < histCurveX.size(); i++) {

    double leftX = histCurveX[i][0];
    double rightX = histCurveX[i][1];

    double leftY = histCurveY[i];
    double rightY = histCurveY[i];
    if (smoothBins) {
      if (i > 0) {
        leftY = 0.5 * (histCurveY[i - 1] + histCurveY[i]);
      }
      if (i < histCurveX.size() - 1) {
        rightY = 0.5 * (histCurveY[i] + histCurveY[i + 1]);
      }
    }

    // = Lower triangle (lower left, lower right, upper left)
    coords.push_back(glm::vec2{leftX, 0.0});
    coords.push_back(glm::vec2{rightX, 0.0});
    coords.push_back(glm::vec2{leftX, leftY});

    // = Upper triangle (lower right, upper right, upper left)
    coords.push_back(glm::vec2{rightX, 0.0});
    coords.push_back(glm::vec2{rightX, rightY});
    coords.push_back(glm::vec2{leftX, leftY});
  }

  program->setAttribute("a_coord", coords);
  program->setTextureFromColormap("t_colormap", colormap, true);

  // Update current buffer settings
  currBufferWeighted = useWeighted;
  currBufferSmoothed = useSmoothed;
}